

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resizeIndexObject(sqlite3 *db,Index *pIdx,int N)

{
  void *pvVar1;
  int in_EDX;
  long in_RSI;
  int nByte;
  char *zExtra;
  u64 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if ((int)(uint)*(ushort *)(in_RSI + 0x60) < in_EDX) {
    pvVar1 = sqlite3DbMallocZero((sqlite3 *)CONCAT44(in_EDX * 0xb,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffc8);
    if (pvVar1 == (void *)0x0) {
      local_4 = 7;
    }
    else {
      memcpy(pvVar1,*(void **)(in_RSI + 0x40),(ulong)*(ushort *)(in_RSI + 0x60) << 3);
      *(void **)(in_RSI + 0x40) = pvVar1;
      pvVar1 = (void *)((long)in_EDX * 8 + (long)pvVar1);
      memcpy(pvVar1,*(void **)(in_RSI + 8),(ulong)*(ushort *)(in_RSI + 0x60) << 1);
      *(void **)(in_RSI + 8) = pvVar1;
      pvVar1 = (void *)((long)in_EDX * 2 + (long)pvVar1);
      memcpy(pvVar1,*(void **)(in_RSI + 0x38),(ulong)*(ushort *)(in_RSI + 0x60));
      *(void **)(in_RSI + 0x38) = pvVar1;
      *(short *)(in_RSI + 0x60) = (short)in_EDX;
      *(ushort *)(in_RSI + 99) = *(ushort *)(in_RSI + 99) & 0xffef | 0x10;
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int resizeIndexObject(sqlite3 *db, Index *pIdx, int N){
  char *zExtra;
  int nByte;
  if( pIdx->nColumn>=N ) return SQLITE_OK;
  assert( pIdx->isResized==0 );
  nByte = (sizeof(char*) + sizeof(i16) + 1)*N;
  zExtra = sqlite3DbMallocZero(db, nByte);
  if( zExtra==0 ) return SQLITE_NOMEM_BKPT;
  memcpy(zExtra, pIdx->azColl, sizeof(char*)*pIdx->nColumn);
  pIdx->azColl = (const char**)zExtra;
  zExtra += sizeof(char*)*N;
  memcpy(zExtra, pIdx->aiColumn, sizeof(i16)*pIdx->nColumn);
  pIdx->aiColumn = (i16*)zExtra;
  zExtra += sizeof(i16)*N;
  memcpy(zExtra, pIdx->aSortOrder, pIdx->nColumn);
  pIdx->aSortOrder = (u8*)zExtra;
  pIdx->nColumn = N;
  pIdx->isResized = 1;
  return SQLITE_OK;
}